

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QPlatformTextureList_*,_bool>_>::Data
          (Data<QHashPrivate::Node<QPlatformTextureList_*,_bool>_> *this,
          Data<QHashPrivate::Node<QPlatformTextureList_*,_bool>_> *other,size_t reserved)

{
  byte bVar1;
  ulong uVar2;
  Span *pSVar3;
  Entry *pEVar4;
  uchar uVar5;
  uchar uVar6;
  uchar uVar7;
  uchar uVar8;
  uchar uVar9;
  uchar uVar10;
  uchar uVar11;
  uchar uVar12;
  Node<QPlatformTextureList_*,_bool> *pNVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  size_t numBuckets;
  long lVar17;
  R RVar18;
  Bucket BVar19;
  
  (this->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
  uVar2 = other->size;
  this->size = uVar2;
  this->numBuckets = 0;
  if (reserved < uVar2) {
    reserved = uVar2;
  }
  this->seed = other->seed;
  this->spans = (Span *)0x0;
  numBuckets = 0x80;
  if ((0x40 < reserved) && (numBuckets = 0xffffffffffffffff, reserved >> 0x3e == 0)) {
    lVar15 = 0x3f;
    if (reserved != 0) {
      for (; reserved >> lVar15 == 0; lVar15 = lVar15 + -1) {
      }
    }
    numBuckets = 1L << (0x41 - ((byte)lVar15 ^ 0x3f) & 0x3f);
  }
  this->numBuckets = numBuckets;
  RVar18 = allocateSpans(numBuckets);
  this->spans = (Span *)RVar18.spans;
  uVar2 = other->numBuckets;
  if (0x7f < uVar2) {
    lVar15 = 0;
    uVar16 = 0;
    do {
      pSVar3 = other->spans;
      lVar17 = 0;
      do {
        bVar1 = pSVar3->offsets[lVar17 + lVar15];
        if (bVar1 != 0xff) {
          pEVar4 = pSVar3[uVar16].entries;
          uVar14 = *(ulong *)pEVar4[bVar1].storage.data;
          uVar14 = (uVar14 >> 0x20 ^ uVar14) * -0x2917014799a6026d;
          uVar14 = (uVar14 >> 0x20 ^ uVar14) * -0x2917014799a6026d;
          BVar19 = Data<QHashPrivate::Node<QPlatformTextureList*,bool>>::
                   findBucketWithHash<QPlatformTextureList*>
                             ((Data<QHashPrivate::Node<QPlatformTextureList*,bool>> *)this,
                              (QPlatformTextureList **)(pEVar4 + bVar1),
                              uVar14 >> 0x20 ^ this->seed ^ uVar14);
          pNVar13 = Span<QHashPrivate::Node<QPlatformTextureList_*,_bool>_>::insert
                              (BVar19.span,BVar19.index);
          pEVar4 = pEVar4 + bVar1;
          uVar5 = (pEVar4->storage).data[8];
          uVar6 = (pEVar4->storage).data[9];
          uVar7 = (pEVar4->storage).data[10];
          uVar8 = (pEVar4->storage).data[0xb];
          uVar9 = (pEVar4->storage).data[0xc];
          uVar10 = (pEVar4->storage).data[0xd];
          uVar11 = (pEVar4->storage).data[0xe];
          uVar12 = (pEVar4->storage).data[0xf];
          pNVar13->key = *(QPlatformTextureList **)(pEVar4->storage).data;
          pNVar13->value = (bool)uVar5;
          pNVar13->field_0x9 = uVar6;
          pNVar13->field_0xa = uVar7;
          pNVar13->field_0xb = uVar8;
          pNVar13->field_0xc = uVar9;
          pNVar13->field_0xd = uVar10;
          pNVar13->field_0xe = uVar11;
          pNVar13->field_0xf = uVar12;
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 != 0x80);
      uVar16 = uVar16 + 1;
      lVar15 = lVar15 + 0x90;
    } while (uVar16 != uVar2 >> 7);
  }
  return;
}

Assistant:

Data(const Data &other, size_t reserved) : size(other.size), seed(other.seed)
    {
        numBuckets = GrowthPolicy::bucketsForCapacity(qMax(size, reserved));
        spans = allocateSpans(numBuckets).spans;
        size_t otherNSpans = other.numBuckets >> SpanConstants::SpanShift;
        reallocationHelper<true>(other, otherNSpans);
    }